

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_hexenspecialdecs.cpp
# Opt level: O1

int AF_A_SoAExplode(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  AActor *ent;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined8 uVar9;
  PClass *pPVar10;
  PClassActor *pPVar11;
  AActor *this;
  long lVar12;
  char *__assertion;
  bool bVar13;
  DVector2 v;
  FSoundID local_5c;
  FName local_58;
  undefined4 uStack_54;
  double dStack_50;
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bb2c7;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    ent = (AActor *)(param->field_0).field_1.a;
    if (ent != (AActor *)0x0) {
      if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
        (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar10 = (ent->super_DThinker).super_DObject.Class;
      bVar13 = pPVar10 != (PClass *)0x0;
      if (pPVar10 != pPVar4 && bVar13) {
        do {
          pPVar10 = pPVar10->ParentClass;
          bVar13 = pPVar10 != (PClass *)0x0;
          if (pPVar10 == pPVar4) break;
        } while (pPVar10 != (PClass *)0x0);
      }
      if (!bVar13) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005bb2c7;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005bb29c;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar9 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar9;
        }
        pPVar10 = (PClass *)puVar3[1];
        bVar13 = pPVar10 != (PClass *)0x0;
        if (pPVar10 != pPVar4 && bVar13) {
          do {
            pPVar10 = pPVar10->ParentClass;
            bVar13 = pPVar10 != (PClass *)0x0;
            if (pPVar10 == pPVar4) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        if (!bVar13) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005bb2c7;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      lVar12 = 0;
      do {
        uVar6 = FRandom::GenRand32(&pr_soaexplode);
        uVar7 = FRandom::GenRand32(&pr_soaexplode);
        uVar8 = FRandom::GenRand32(&pr_soaexplode);
        dVar1 = ent->Height;
        iVar5 = FName::NameManager::FindName(&FName::NameData,"ZArmorChunk",false);
        P_GetOffsetPosition((ent->__Pos).X,(ent->__Pos).Y,
                            (double)(int)((uVar6 & 0xff) - 0x80) * 0.0625,
                            (double)(int)((uVar7 & 0xff) - 0x80) * 0.0625);
        local_48.Z = (double)(uVar8 & 0xff) * dVar1 * 0.00390625 + (ent->__Pos).Z;
        local_48.X = (double)CONCAT44(uStack_54,local_58.Index);
        local_48.Y = dStack_50;
        local_58.Index = iVar5;
        pPVar11 = ClassForSpawn(&local_58);
        this = AActor::StaticSpawn(pPVar11,&local_48,ALLOW_REPLACE,false);
        if (this != (AActor *)0x0) {
          AActor::SetState(this,(FState *)((long)&this->SpawnState->NextState + lVar12),false);
          uVar6 = FRandom::GenRand32(&pr_soaexplode);
          uVar7 = FRandom::GenRand32(&pr_soaexplode);
          (this->Vel).X = (double)(int)((uVar6 & 0xff) - (uVar7 & 0xff)) * 0.015625;
          uVar6 = FRandom::GenRand32(&pr_soaexplode);
          uVar7 = FRandom::GenRand32(&pr_soaexplode);
          (this->Vel).Y = (double)(int)((uVar6 & 0xff) - (uVar7 & 0xff)) * 0.015625;
          uVar6 = FRandom::GenRand32(&pr_soaexplode);
          (this->Vel).Z = (double)((uVar6 & 7) + 5);
        }
        lVar12 = lVar12 + 0x28;
      } while (lVar12 != 400);
      pPVar11 = P_GetSpawnableType(ent->args[0]);
      if ((pPVar11 != (PClassActor *)0x0) &&
         ((((level.flags2._1_1_ & 0x80) == 0 && ((dmflags.Value._1_1_ & 0x10) == 0)) ||
          (((pPVar11->super_PClass).Defaults[0x195] & 0x20) == 0)))) {
        local_48.X = (ent->__Pos).X;
        local_48.Y = (ent->__Pos).Y;
        local_48.Z = (ent->__Pos).Z;
        AActor::StaticSpawn(pPVar11,&local_48,ALLOW_REPLACE,false);
      }
      local_5c.ID = (ent->DeathSound).super_FSoundID.ID;
      S_Sound(ent,4,&local_5c,1.0,1.0);
      (*(ent->super_DThinker).super_DObject._vptr_DObject[4])(ent);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005bb29c:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005bb2c7:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_hexenspecialdecs.cpp"
                ,0x130,"int AF_A_SoAExplode(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SoAExplode)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	int i;

	for (i = 0; i < 10; i++)
	{
		double xo = (pr_soaexplode() - 128) / 16.;
		double yo = (pr_soaexplode() - 128) / 16.;
		double zo = pr_soaexplode()*self->Height / 256.;
		mo = Spawn ("ZArmorChunk", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
		if (mo)
		{
			mo->SetState (mo->SpawnState + i);
			mo->Vel.X = pr_soaexplode.Random2() / 64.;
			mo->Vel.Y = pr_soaexplode.Random2() / 64.;
			mo->Vel.Z = (pr_soaexplode() & 7) + 5;
		}
	}
	// Spawn an item?
	PClassActor *type = P_GetSpawnableType(self->args[0]);
	if (type != NULL)
	{
		if (!((level.flags2 & LEVEL2_NOMONSTERS) || (dmflags & DF_NO_MONSTERS))
		|| !(GetDefaultByType (type)->flags3 & MF3_ISMONSTER))
		{ // Only spawn monsters if not -nomonsters
			Spawn (type, self->Pos(), ALLOW_REPLACE);
		}
	}
	S_Sound (self, CHAN_BODY, self->DeathSound, 1, ATTN_NORM);
	self->Destroy ();
	return 0;
}